

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O3

Type * soul::createMIDIEventEndpointType(void)

{
  Structure *this;
  Type *in_RDI;
  string local_78;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  ReadWriteCount local_20;
  
  this = (Structure *)operator_new(0x288);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Message","");
  Structure::Structure(this,&local_78,(void *)0x0);
  (this->super_RefCountedObject).refCount = (this->super_RefCountedObject).refCount + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_58[0] = primitive;
  local_58[1] = invalid;
  local_58[2] = false;
  local_58[3] = false;
  local_58._4_4_ = int32;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_8_ = (Structure *)0x0;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"midiBytes","");
  local_20.numReads = 0;
  local_20.numWrites = 0;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back(&this->members,(Member *)local_58)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_58._16_8_);
  in_RDI->category = structure;
  *(undefined8 *)&in_RDI->arrayElementCategory = 0;
  in_RDI->boundingSize = 0;
  in_RDI->arrayElementBoundingSize = 0;
  (in_RDI->structure).object = this;
  (this->super_RefCountedObject).refCount = (this->super_RefCountedObject).refCount + 1;
  RefCountedPtr<soul::Structure>::decIfNotNull(this);
  return in_RDI;
}

Assistant:

Type createMIDIEventEndpointType()
{
    StructurePtr s (*new Structure ("Message", nullptr));
    s->getMembers().push_back ({ PrimitiveType::int32, "midiBytes" });
    return Type::createStruct (*s);
}